

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void log_sub_block_var(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,double *var_min,double *var_max)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double *in_RCX;
  byte in_DL;
  long in_RSI;
  double *in_R8;
  double dVar5;
  int var;
  int j;
  int i;
  aom_variance_fn_t vf;
  double max_var_4x4;
  double min_var_4x4;
  int bh;
  int bw;
  int bottom_overflow;
  int right_overflow;
  int is_hbd;
  MACROBLOCKD *xd;
  double in_stack_ffffffffffffff78;
  uint8_t *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int local_70;
  int local_68;
  int local_64;
  double local_58;
  uint8_t *local_50;
  
  is_cur_buf_hbd((MACROBLOCKD *)(in_RSI + 0x1a0));
  if (*(int *)(in_RSI + 0x2098) < 0) {
    local_70 = -*(int *)(in_RSI + 0x2098) >> 3;
  }
  else {
    local_70 = 0;
  }
  if (*(int *)(in_RSI + 0x20a0) < 0) {
    iVar2 = -*(int *)(in_RSI + 0x20a0) >> 3;
  }
  else {
    iVar2 = 0;
  }
  bVar1 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[in_DL];
  iVar3 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"[in_DL]
          * 4 - iVar2;
  local_50 = (uint8_t *)0x41dfffffffc00000;
  local_58 = 0.0;
  for (local_64 = 0; local_64 < iVar3; local_64 = local_64 + 4) {
    for (local_68 = 0; local_68 < (int)((uint)bVar1 * 4 - local_70); local_68 = local_68 + 4) {
      iVar4 = av1_calc_normalized_variance
                        ((aom_variance_fn_t)CONCAT44(iVar2,in_stack_ffffffffffffff88),
                         in_stack_ffffffffffffff80,(int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                         SUB84(in_stack_ffffffffffffff78,0));
      if ((double)iVar4 <= (double)local_50) {
        local_50 = (uint8_t *)(double)iVar4;
      }
      if (local_58 <= (double)iVar4) {
        local_58 = (double)iVar4;
      }
      in_stack_ffffffffffffff78 = local_58;
      in_stack_ffffffffffffff80 = local_50;
    }
  }
  dVar5 = log1p((double)local_50 / 16.0);
  *in_RCX = dVar5;
  dVar5 = log1p(local_58 / 16.0);
  *in_R8 = dVar5;
  return;
}

Assistant:

static void log_sub_block_var(const AV1_COMP *cpi, MACROBLOCK *x, BLOCK_SIZE bs,
                              double *var_min, double *var_max) {
  // This functions returns a the minimum and maximum log variances for 4x4
  // sub blocks in the current block.

  const MACROBLOCKD *const xd = &x->e_mbd;
  const int is_hbd = is_cur_buf_hbd(xd);
  const int right_overflow =
      (xd->mb_to_right_edge < 0) ? ((-xd->mb_to_right_edge) >> 3) : 0;
  const int bottom_overflow =
      (xd->mb_to_bottom_edge < 0) ? ((-xd->mb_to_bottom_edge) >> 3) : 0;
  const int bw = MI_SIZE * mi_size_wide[bs] - right_overflow;
  const int bh = MI_SIZE * mi_size_high[bs] - bottom_overflow;

  // Initialize minimum variance to a large value and maximum variance to 0.
  double min_var_4x4 = (double)INT_MAX;
  double max_var_4x4 = 0.0;

  aom_variance_fn_t vf = cpi->ppi->fn_ptr[BLOCK_4X4].vf;
  for (int i = 0; i < bh; i += MI_SIZE) {
    for (int j = 0; j < bw; j += MI_SIZE) {
      int var;
      // Calculate the 4x4 sub-block variance.
      var = av1_calc_normalized_variance(
          vf, x->plane[0].src.buf + (i * x->plane[0].src.stride) + j,
          x->plane[0].src.stride, is_hbd);

      // Record min and max for over-arching block
      min_var_4x4 = AOMMIN(min_var_4x4, var);
      max_var_4x4 = AOMMAX(max_var_4x4, var);
    }
  }
  *var_min = log1p(min_var_4x4 / 16.0);
  *var_max = log1p(max_var_4x4 / 16.0);
}